

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_ArrayIo_Test::TestBody(IoTest_ArrayIo_Test *this)

{
  undefined1 local_178 [8];
  ArrayInputStream input;
  undefined1 local_148 [8];
  ArrayOutputStream output;
  int local_120;
  int size;
  int j;
  int i;
  uint8_t buffer [256];
  int kBufferSize;
  IoTest_ArrayIo_Test *this_local;
  
  buffer[0xfc] = '\0';
  buffer[0xfd] = '\x01';
  buffer[0xfe] = '\0';
  buffer[0xff] = '\0';
  for (size = 0; size < 8; size = size + 1) {
    for (local_120 = 0; local_120 < 8; local_120 = local_120 + 1) {
      ArrayOutputStream::ArrayOutputStream
                ((ArrayOutputStream *)local_148,&j,0x100,
                 *(int *)(io::(anonymous_namespace)::IoTest::kBlockSizes + (long)size * 4));
      output.last_returned_size_ =
           IoTest::WriteStuff(&this->super_IoTest,(ZeroCopyOutputStream *)local_148);
      ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)local_148);
      ArrayInputStream::ArrayInputStream
                ((ArrayInputStream *)local_178,&j,output.last_returned_size_,
                 *(int *)(io::(anonymous_namespace)::IoTest::kBlockSizes + (long)local_120 * 4));
      IoTest::ReadStuff(&this->super_IoTest,(ZeroCopyInputStream *)local_178,true);
      ArrayInputStream::~ArrayInputStream((ArrayInputStream *)local_178);
    }
  }
  return;
}

Assistant:

TEST_F(IoTest, ArrayIo) {
  const int kBufferSize = 256;
  uint8_t buffer[kBufferSize];

  for (int i = 0; i < kBlockSizeCount; i++) {
    for (int j = 0; j < kBlockSizeCount; j++) {
      int size;
      {
        ArrayOutputStream output(buffer, kBufferSize, kBlockSizes[i]);
        size = WriteStuff(&output);
      }
      {
        ArrayInputStream input(buffer, size, kBlockSizes[j]);
        ReadStuff(&input);
      }
    }
  }
}